

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

char * __thiscall
CClient::LoadMapSearch(CClient *this,char *pMapName,SHA256_DIGEST *pWantedSha256,int WantedCrc)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char aFilename [128];
  char aWanted [81];
  char aBuf [512];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aWanted[0] = '\0';
  if (pWantedSha256 != (SHA256_DIGEST *)0x0) {
    sha256_str(*(SHA256_DIGEST *)pWantedSha256->data,aBuf,0x41);
    str_format(aWanted,0x51,"sha256=%s ",aBuf);
  }
  iVar2 = WantedCrc;
  str_format(aBuf,0x200,"loading map, map=%s wanted %scrc=%08x",pMapName,aWanted);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])(this->m_pConsole,1,"client",aBuf,0)
  ;
  SetState(this,2);
  str_format(aBuf,0x200,"maps/%s.map",pMapName);
  pcVar3 = LoadMap(this,pMapName,aBuf,pWantedSha256,WantedCrc);
  pcVar4 = (char *)0x0;
  if (pcVar3 != (char *)0x0) {
    FormatMapDownloadFilename(pMapName,pWantedSha256,WantedCrc,false,aBuf,iVar2);
    pcVar3 = LoadMap(this,pMapName,aBuf,pWantedSha256,WantedCrc);
    pcVar4 = (char *)0x0;
    if (pcVar3 != (char *)0x0) {
      if (pWantedSha256 != (SHA256_DIGEST *)0x0) {
        FormatMapDownloadFilename(pMapName,(SHA256_DIGEST *)0x0,WantedCrc,false,aBuf,iVar2);
        pcVar3 = LoadMap(this,pMapName,aBuf,pWantedSha256,WantedCrc);
        pcVar4 = (char *)0x0;
        if (pcVar3 == (char *)0x0) goto LAB_00118d68;
      }
      str_format(aFilename,0x80,"%s.map",pMapName);
      iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[7])
                        (this->m_pStorage,aFilename,"maps",0xffffffffffffffff,aBuf,0x200);
      pcVar4 = pcVar3;
      if ((char)iVar2 != '\0') {
        pcVar4 = LoadMap(this,pMapName,aBuf,pWantedSha256,WantedCrc);
      }
    }
  }
LAB_00118d68:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar4;
  }
  __stack_chk_fail();
}

Assistant:

const char *CClient::LoadMapSearch(const char *pMapName, const SHA256_DIGEST *pWantedSha256, int WantedCrc)
{
	const char *pError = 0;
	char aBuf[512];
	char aWanted[SHA256_MAXSTRSIZE + 16];
	aWanted[0] = 0;
	if(pWantedSha256)
	{
		char aWantedSha256[SHA256_MAXSTRSIZE];
		sha256_str(*pWantedSha256, aWantedSha256, sizeof(aWantedSha256));
		str_format(aWanted, sizeof(aWanted), "sha256=%s ", aWantedSha256);
	}
	str_format(aBuf, sizeof(aBuf), "loading map, map=%s wanted %scrc=%08x", pMapName, aWanted, WantedCrc);
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
	SetState(IClient::STATE_LOADING);

	// try the normal maps folder
	str_format(aBuf, sizeof(aBuf), "maps/%s.map", pMapName);
	pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
	if(!pError)
		return pError;

	// try the downloaded maps
	FormatMapDownloadFilename(pMapName, pWantedSha256, WantedCrc, false, aBuf, sizeof(aBuf));
	pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
	if(!pError)
		return pError;

	// backward compatibility with old names
	if(pWantedSha256)
	{
		FormatMapDownloadFilename(pMapName, 0, WantedCrc, false, aBuf, sizeof(aBuf));
		pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
		if(!pError)
			return pError;
	}

	// search for the map within subfolders
	char aFilename[128];
	str_format(aFilename, sizeof(aFilename), "%s.map", pMapName);
	if(Storage()->FindFile(aFilename, "maps", IStorage::TYPE_ALL, aBuf, sizeof(aBuf)))
		pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);

	return pError;
}